

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

int oonf_layer2_neigh_key_from_string(oonf_layer2_neigh_key *key,char *string)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  netaddr_str nbuf;
  char local_5e [62];
  
  *(undefined8 *)&(key->addr)._type = 0;
  key->link_id[5] = '\0';
  key->link_id[6] = '\0';
  key->link_id[7] = '\0';
  key->link_id[8] = '\0';
  key->link_id[9] = '\0';
  key->link_id[10] = '\0';
  key->link_id[0xb] = '\0';
  key->link_id[0xc] = '\0';
  (key->addr)._addr[0] = '\0';
  (key->addr)._addr[1] = '\0';
  (key->addr)._addr[2] = '\0';
  (key->addr)._addr[3] = '\0';
  (key->addr)._addr[4] = '\0';
  (key->addr)._addr[5] = '\0';
  (key->addr)._addr[6] = '\0';
  (key->addr)._addr[7] = '\0';
  (key->addr)._addr[8] = '\0';
  (key->addr)._addr[9] = '\0';
  (key->addr)._addr[10] = '\0';
  (key->addr)._addr[0xb] = '\0';
  (key->addr)._addr[0xc] = '\0';
  (key->addr)._addr[0xd] = '\0';
  (key->addr)._addr[0xe] = '\0';
  (key->addr)._addr[0xf] = '\0';
  key->link_id[0xc] = '\0';
  key->link_id[0xd] = '\0';
  key->link_id[0xe] = '\0';
  key->link_id[0xf] = '\0';
  pcVar2 = strchr(string,0x2c);
  if (pcVar2 != (char *)0x0) {
    if (0x3e < (long)pcVar2 - (long)string) {
      return -1;
    }
    strscpy(local_5e,string,((long)pcVar2 - (long)string) + 1);
    lVar3 = strhex_to_bin(key->link_id,0x10,pcVar2 + 1);
    if (lVar3 < 0) {
      return -2;
    }
    key->link_id_length = (uint8_t)lVar3;
    string = local_5e;
  }
  iVar1 = netaddr_from_string(key,string);
  iVar4 = -3;
  if ((iVar1 == 0) && (iVar4 = -4, (byte)((key->addr)._type - 0x2f) < 2)) {
    return 0;
  }
  (key->addr)._addr[0] = '\0';
  (key->addr)._addr[1] = '\0';
  (key->addr)._addr[2] = '\0';
  (key->addr)._addr[3] = '\0';
  (key->addr)._addr[4] = '\0';
  (key->addr)._addr[5] = '\0';
  (key->addr)._addr[6] = '\0';
  (key->addr)._addr[7] = '\0';
  (key->addr)._addr[8] = '\0';
  (key->addr)._addr[9] = '\0';
  (key->addr)._addr[10] = '\0';
  (key->addr)._addr[0xb] = '\0';
  (key->addr)._addr[0xc] = '\0';
  (key->addr)._addr[0xd] = '\0';
  (key->addr)._addr[0xe] = '\0';
  (key->addr)._addr[0xf] = '\0';
  (key->addr)._type = '\0';
  (key->addr)._prefix_len = '\0';
  return iVar4;
}

Assistant:

int
oonf_layer2_neigh_key_from_string(struct oonf_layer2_neigh_key *key, const char *string) {
  struct netaddr_str nbuf;
  const char *split, *addr;
  ssize_t len;

  memset(key, 0, sizeof(*key));
  split = strchr(string, ',');

  if (!split) {
    addr = string;
  }
  else {
    len = split - string;
    if (len > (ssize_t)(sizeof(nbuf))) {
      return -1;
    }

    strscpy(nbuf.buf, string, len+1);
    addr = nbuf.buf;

    split++;
    len = strhex_to_bin(key->link_id, sizeof(key->link_id), split);
    if (len < 0) {
      return -2;
    }
    key->link_id_length = len;
  }

  if (netaddr_from_string(&key->addr, addr)) {
    netaddr_invalidate(&key->addr);
    return -3;
  }
  if (netaddr_get_address_family(&key->addr) != AF_MAC48
      && netaddr_get_address_family(&key->addr) != AF_EUI64) {
    netaddr_invalidate(&key->addr);
    return -4;
  }
  return 0;
}